

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O2

char * libssh2_userauth_list(LIBSSH2_SESSION *session,char *user,uint user_len)

{
  size_t *data_len;
  uchar **data;
  libssh2_nonblocking_states lVar1;
  uchar uVar2;
  int iVar3;
  uint32_t uVar4;
  time_t start_time;
  uchar *puVar5;
  ulong uVar6;
  char *pcVar7;
  uchar reply_codes [4];
  uchar *local_38;
  
  start_time = time((time_t *)0x0);
  data_len = &session->userauth_list_data_len;
  data = &session->userauth_list_data;
  do {
    builtin_memcpy(reply_codes,"435",4);
    lVar1 = session->userauth_list_state;
    if (lVar1 == libssh2_NB_state_sent) {
LAB_00126480:
      iVar3 = _libssh2_packet_requirev
                        (session,reply_codes,data,data_len,0,(uchar *)0x0,0,
                         &session->userauth_list_packet_requirev_state);
      if (iVar3 == 0) {
        uVar6 = *data_len;
        if (uVar6 == 0) goto LAB_001265ef;
        puVar5 = *data;
        uVar2 = *puVar5;
        if (uVar2 != '5') {
LAB_001265ba:
          if (uVar2 != '4') {
            if (uVar6 < 5) goto LAB_00126612;
            uVar4 = _libssh2_ntohu32(puVar5 + 1);
            uVar6 = (ulong)uVar4;
            if (uVar6 < *data_len - 5) {
              memmove(*data,*data + 5,uVar6);
              (*data)[uVar6] = '\0';
              goto LAB_00126662;
            }
            iVar3 = -0x29;
            pcVar7 = "Unexpected userauth list size";
            goto LAB_001264bd;
          }
          _libssh2_error(session,0,"No error");
          (*session->free)(session->userauth_list_data,&session->abstract);
          session->userauth_list_data = (uchar *)0x0;
          *(byte *)&session->state = (byte)session->state | 4;
          goto LAB_00126600;
        }
        if (uVar6 < 5) {
LAB_00126612:
          (*session->free)(puVar5,&session->abstract);
          session->userauth_list_data = (uchar *)0x0;
          iVar3 = -0xe;
          pcVar7 = "Unexpected packet size";
        }
        else {
          uVar4 = _libssh2_ntohu32(puVar5 + 1);
          uVar6 = (ulong)uVar4;
          if (*data_len - 5 < uVar6) {
            (*session->free)(session->userauth_list_data,&session->abstract);
            session->userauth_list_data = (uchar *)0x0;
            iVar3 = -0x29;
            pcVar7 = "Unexpected userauth banner size";
          }
          else {
            pcVar7 = (char *)(*session->alloc)((long)uVar4 + 1,&session->abstract);
            session->userauth_banner = pcVar7;
            if (pcVar7 != (char *)0x0) {
              memcpy(pcVar7,session->userauth_list_data + 5,uVar6);
              session->userauth_banner[uVar6] = '\0';
              (*session->free)(session->userauth_list_data,&session->abstract);
              session->userauth_list_data = (uchar *)0x0;
              reply_codes[2] = '\0';
              iVar3 = _libssh2_packet_requirev
                                (session,reply_codes,data,data_len,0,(uchar *)0x0,0,
                                 &session->userauth_list_packet_requirev_state);
              if (iVar3 != 0) goto LAB_001264a7;
              uVar6 = *data_len;
              if (uVar6 == 0) goto LAB_001265ef;
              puVar5 = *data;
              uVar2 = *puVar5;
              goto LAB_001265ba;
            }
            (*session->free)(session->userauth_list_data,&session->abstract);
            session->userauth_list_data = (uchar *)0x0;
            iVar3 = -6;
            pcVar7 = "Unable to allocate memory for userauth_banner";
          }
        }
LAB_001264bd:
        _libssh2_error(session,iVar3,pcVar7);
      }
      else {
LAB_001264a7:
        if (iVar3 == -0x25) {
LAB_001264b0:
          iVar3 = -0x25;
          pcVar7 = "Would block requesting userauth list";
          goto LAB_001264bd;
        }
LAB_001265ef:
        pcVar7 = "Failed getting response";
LAB_001265fb:
        _libssh2_error(session,iVar3,pcVar7);
LAB_00126600:
        session->userauth_list_state = libssh2_NB_state_idle;
      }
      puVar5 = (uchar *)0x0;
    }
    else {
      if (lVar1 == libssh2_NB_state_created) {
LAB_00126412:
        iVar3 = _libssh2_transport_send
                          (session,session->userauth_list_data,session->userauth_list_data_len,
                           (uchar *)"none",4);
        if (iVar3 == -0x25) goto LAB_001264b0;
        (*session->free)(session->userauth_list_data,&session->abstract);
        session->userauth_list_data = (uchar *)0x0;
        if (iVar3 == 0) {
          session->userauth_list_state = libssh2_NB_state_sent;
          goto LAB_00126480;
        }
        iVar3 = -7;
        pcVar7 = "Unable to send userauth-none request";
        goto LAB_001265fb;
      }
      if (lVar1 == libssh2_NB_state_idle) {
        (session->userauth_list_packet_requirev_state).start = 0;
        session->userauth_list_data_len = (ulong)(user_len + 0x1b);
        puVar5 = (uchar *)(*session->alloc)((ulong)(user_len + 0x1b),&session->abstract);
        session->userauth_list_data = puVar5;
        if (puVar5 != (uchar *)0x0) {
          local_38 = puVar5 + 1;
          *puVar5 = '2';
          _libssh2_store_str(&local_38,user,(ulong)user_len);
          _libssh2_store_str(&local_38,"ssh-connection",0xe);
          _libssh2_store_u32(&local_38,4);
          session->userauth_list_state = libssh2_NB_state_created;
          goto LAB_00126412;
        }
        iVar3 = -6;
        pcVar7 = "Unable to allocate memory for userauth_list";
        goto LAB_001264bd;
      }
LAB_00126662:
      session->userauth_list_state = libssh2_NB_state_idle;
      puVar5 = session->userauth_list_data;
    }
    if (session->api_block_mode == 0) {
      return (char *)puVar5;
    }
    if (puVar5 != (uchar *)0x0) {
      return (char *)puVar5;
    }
    iVar3 = libssh2_session_last_errno(session);
    if ((iVar3 != -0x25) || (iVar3 = _libssh2_wait_socket(session,start_time), iVar3 != 0)) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

static char *userauth_list(LIBSSH2_SESSION *session, const char *username,
                           unsigned int username_len)
{
    unsigned char reply_codes[4] =
        { SSH_MSG_USERAUTH_SUCCESS, SSH_MSG_USERAUTH_FAILURE,
          SSH_MSG_USERAUTH_BANNER, 0 };
    /* packet_type(1) + username_len(4) + service_len(4) +
       service(14)"ssh-connection" + method_len(4) = 27 */
    unsigned long methods_len;
    unsigned int banner_len;
    unsigned char *s;
    int rc;

    if(session->userauth_list_state == libssh2_NB_state_idle) {
        /* Zero the whole thing out */
        memset(&session->userauth_list_packet_requirev_state, 0,
               sizeof(session->userauth_list_packet_requirev_state));

        session->userauth_list_data_len = username_len + 27;

        s = session->userauth_list_data =
            LIBSSH2_ALLOC(session, session->userauth_list_data_len);
        if(!session->userauth_list_data) {
            _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                           "Unable to allocate memory for userauth_list");
            return NULL;
        }

        *(s++) = SSH_MSG_USERAUTH_REQUEST;
        _libssh2_store_str(&s, username, username_len);
        _libssh2_store_str(&s, "ssh-connection", 14);
        _libssh2_store_u32(&s, 4); /* send "none" separately */

        session->userauth_list_state = libssh2_NB_state_created;
    }

    if(session->userauth_list_state == libssh2_NB_state_created) {
        rc = _libssh2_transport_send(session, session->userauth_list_data,
                                     session->userauth_list_data_len,
                                     (unsigned char *)"none", 4);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block requesting userauth list");
            return NULL;
        }
        /* now free the packet that was sent */
        LIBSSH2_FREE(session, session->userauth_list_data);
        session->userauth_list_data = NULL;

        if(rc) {
            _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                           "Unable to send userauth-none request");
            session->userauth_list_state = libssh2_NB_state_idle;
            return NULL;
        }

        session->userauth_list_state = libssh2_NB_state_sent;
    }

    if(session->userauth_list_state == libssh2_NB_state_sent) {
        rc = _libssh2_packet_requirev(session, reply_codes,
                                      &session->userauth_list_data,
                                      &session->userauth_list_data_len, 0,
                                      NULL, 0,
                               &session->userauth_list_packet_requirev_state);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block requesting userauth list");
            return NULL;
        }
        else if(rc || (session->userauth_list_data_len < 1)) {
            _libssh2_error(session, rc, "Failed getting response");
            session->userauth_list_state = libssh2_NB_state_idle;
            return NULL;
        }

        if(session->userauth_list_data[0] == SSH_MSG_USERAUTH_BANNER) {
            if(session->userauth_list_data_len < 5) {
                LIBSSH2_FREE(session, session->userauth_list_data);
                session->userauth_list_data = NULL;
                _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                               "Unexpected packet size");
                return NULL;
            }
            banner_len = _libssh2_ntohu32(session->userauth_list_data + 1);
            if(banner_len > session->userauth_list_data_len - 5) {
                LIBSSH2_FREE(session, session->userauth_list_data);
                session->userauth_list_data = NULL;
                _libssh2_error(session, LIBSSH2_ERROR_OUT_OF_BOUNDARY,
                               "Unexpected userauth banner size");
                return NULL;
            }
            session->userauth_banner = LIBSSH2_ALLOC(session, banner_len + 1);
            if(!session->userauth_banner) {
                LIBSSH2_FREE(session, session->userauth_list_data);
                session->userauth_list_data = NULL;
                _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                              "Unable to allocate memory for userauth_banner");
                return NULL;
            }
            memcpy(session->userauth_banner, session->userauth_list_data + 5,
                    banner_len);
            session->userauth_banner[banner_len] = '\0';
            _libssh2_debug((session, LIBSSH2_TRACE_AUTH,
                           "Banner: %s",
                           session->userauth_banner));
            LIBSSH2_FREE(session, session->userauth_list_data);
            session->userauth_list_data = NULL;
            /* SSH_MSG_USERAUTH_BANNER has been handled */
            reply_codes[2] = 0;
            rc = _libssh2_packet_requirev(session, reply_codes,
                                          &session->userauth_list_data,
                                          &session->userauth_list_data_len, 0,
                                          NULL, 0,
                                &session->userauth_list_packet_requirev_state);
            if(rc == LIBSSH2_ERROR_EAGAIN) {
                _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                               "Would block requesting userauth list");
                return NULL;
            }
            else if(rc || (session->userauth_list_data_len < 1)) {
                _libssh2_error(session, rc, "Failed getting response");
                session->userauth_list_state = libssh2_NB_state_idle;
                return NULL;
            }
        }

        if(session->userauth_list_data[0] == SSH_MSG_USERAUTH_SUCCESS) {
            /* Wow, who'dve thought... */
            _libssh2_error(session, LIBSSH2_ERROR_NONE, "No error");
            LIBSSH2_FREE(session, session->userauth_list_data);
            session->userauth_list_data = NULL;
            session->state |= LIBSSH2_STATE_AUTHENTICATED;
            session->userauth_list_state = libssh2_NB_state_idle;
            return NULL;
        }

        if(session->userauth_list_data_len < 5) {
            LIBSSH2_FREE(session, session->userauth_list_data);
            session->userauth_list_data = NULL;
            _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                           "Unexpected packet size");
            return NULL;
        }

        methods_len = _libssh2_ntohu32(session->userauth_list_data + 1);
        if(methods_len >= session->userauth_list_data_len - 5) {
            _libssh2_error(session, LIBSSH2_ERROR_OUT_OF_BOUNDARY,
                           "Unexpected userauth list size");
            return NULL;
        }

        /* Do note that the memory areas overlap! */
        memmove(session->userauth_list_data, session->userauth_list_data + 5,
                methods_len);
        session->userauth_list_data[methods_len] = '\0';
        _libssh2_debug((session, LIBSSH2_TRACE_AUTH,
                       "Permitted auth methods: %s",
                       session->userauth_list_data));
    }

    session->userauth_list_state = libssh2_NB_state_idle;
    return (char *)session->userauth_list_data;
}